

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.cpp
# Opt level: O2

bool __thiscall
AEADChaCha20Poly1305::Decrypt
          (AEADChaCha20Poly1305 *this,Span<const_std::byte> cipher,Span<const_std::byte> aad,
          Nonce96 nonce,Span<std::byte> plain1,Span<std::byte> plain2)

{
  long lVar1;
  Span<std::byte> tag;
  size_t sVar2;
  byte bVar3;
  long lVar4;
  long in_FS_OFFSET;
  Nonce96 nonce_00;
  Span<const_std::byte> input;
  Span<const_std::byte> input_00;
  Span<const_std::byte> cipher_00;
  byte expected_tag [16];
  
  sVar2 = cipher.m_size;
  input.m_data = cipher.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (plain2.m_size + plain1.m_size + 0x10 != sVar2) {
    __assert_fail("cipher.size() == plain1.size() + plain2.size() + EXPANSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/chacha20poly1305.cpp"
                  ,0x55,
                  "bool AEADChaCha20Poly1305::Decrypt(Span<const std::byte>, Span<const std::byte>, Nonce96, Span<std::byte>, Span<std::byte>)"
                 );
  }
  nonce_00._4_4_ = 0;
  nonce_00.first = nonce.first;
  nonce_00.second = nonce.second;
  ChaCha20::Seek(&this->m_chacha20,nonce_00,0);
  tag.m_size = 0x10;
  tag.m_data = expected_tag;
  cipher_00.m_size = sVar2 - 0x10;
  cipher_00.m_data = input.m_data;
  anon_unknown.dwarf_23c6bde::ComputeTag(&this->m_chacha20,aad,cipher_00,tag);
  bVar3 = 0;
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    bVar3 = bVar3 | input.m_data[lVar4 + (sVar2 - 0x10)] ^ expected_tag[lVar4];
  }
  if (bVar3 == 0) {
    input.m_size = plain1.m_size;
    ChaCha20::Crypt(&this->m_chacha20,input,plain1);
    input_00.m_size = plain2.m_size;
    input_00.m_data = input.m_data + plain1.m_size;
    ChaCha20::Crypt(&this->m_chacha20,input_00,plain2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool AEADChaCha20Poly1305::Decrypt(Span<const std::byte> cipher, Span<const std::byte> aad, Nonce96 nonce, Span<std::byte> plain1, Span<std::byte> plain2) noexcept
{
    assert(cipher.size() == plain1.size() + plain2.size() + EXPANSION);

    // Verify tag (using key drawn from block 0).
    m_chacha20.Seek(nonce, 0);
    std::byte expected_tag[EXPANSION];
    ComputeTag(m_chacha20, aad, cipher.first(cipher.size() - EXPANSION), expected_tag);
    if (timingsafe_bcmp_internal(UCharCast(expected_tag), UCharCast(cipher.last(EXPANSION).data()), EXPANSION)) return false;

    // Decrypt (starting at block 1).
    m_chacha20.Crypt(cipher.first(plain1.size()), plain1);
    m_chacha20.Crypt(cipher.subspan(plain1.size()).first(plain2.size()), plain2);
    return true;
}